

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

TonkResult tonk_inject(TonkSocket tonkSocket,uint16_t sourcePort,void *data,uint32_t bytes)

{
  TonkResult TVar1;
  undefined6 in_register_00000032;
  Result result;
  
  if ((bytes == 0 || data == (void *)0x0) ||
      ((int)CONCAT62(in_register_00000032,sourcePort) == 0 || tonkSocket == (TonkSocket)0x0)) {
    TVar1 = Tonk_InvalidInput;
  }
  else {
    tonk::ApplicationSession::tonk_inject
              ((ApplicationSession *)&result,(uint16_t)tonkSocket,(uint8_t *)(ulong)sourcePort,
               (uint32_t)data);
    TVar1 = TonkResultFromDetailedResult(&result);
    tonk::Result::~Result(&result);
  }
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_inject(
    TonkSocket   tonkSocket, ///< [in] Socket to inject
    uint16_t     sourcePort, ///< [in] Source port of datagram
    const void*        data, ///< [in] Datagram data
    uint32_t          bytes  ///< [in] Datagram bytes
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (!session || sourcePort == 0 || !data || bytes <= 0)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = session->tonk_inject(
        sourcePort,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}